

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O0

void htable_fini(HTABLE *htable,_func_void_HTABLE_NODE_ptr *dtor_func)

{
  long lVar1;
  code *in_RSI;
  long *in_RDI;
  HTABLE_NODE *node;
  HTABLE_NODE **plane;
  size_t index;
  uint i;
  HTABLE *in_stack_ffffffffffffffd0;
  ulong local_20;
  uint local_14;
  
  if ((in_RSI != (code *)0x0) && (in_RDI[2] != 0)) {
    for (local_14 = 0; local_14 < *(uint *)(in_RDI + 1); local_14 = local_14 + 1) {
      lVar1 = *(long *)(*in_RDI + (ulong)local_14 * 8);
      for (local_20 = 0; local_20 < (ulong)(long)(0x3b << ((byte)local_14 & 0x1f));
          local_20 = local_20 + 1) {
        while (*(long *)(lVar1 + local_20 * 8) != 0) {
          in_stack_ffffffffffffffd0 = *(HTABLE **)(lVar1 + local_20 * 8);
          *(void ***)(lVar1 + local_20 * 8) = in_stack_ffffffffffffffd0->planes;
          (*in_RSI)(in_stack_ffffffffffffffd0);
        }
      }
    }
  }
  in_RDI[2] = 0;
  htable_free_all_planes(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void
htable_fini(HTABLE* htable, void (*dtor_func)(HTABLE_NODE*))
{
    if(dtor_func != NULL  &&  htable->n > 0) {
        unsigned i;
        size_t index;

        for(i = 0; i < htable->n_planes; i++) {
            HTABLE_NODE** plane = (HTABLE_NODE**) htable->planes[i];
            for(index = 0; index < HTABLE_PLANE_SIZE(i); index++) {
                while(plane[index] != NULL) {
                    HTABLE_NODE* node;

                    node = plane[index];
                    plane[index] = node->next;
                    dtor_func(node);
                }
            }
        }
    }
    htable->n = 0;

    htable_free_all_planes(htable);
}